

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O3

optional<Token> * __thiscall
Tokenizer::NextToken(optional<Token> *__return_storage_ptr__,Tokenizer *this)

{
  string *psVar1;
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  if (this->_initialized == false) {
    readAll(this);
  }
  if (((byte)this->_rdr[*(long *)(*(long *)this->_rdr + -0x18) + 0x20] & 1) == 0) {
    if ((this->_ptr).first <
        (ulong)((long)(this->_lines_buffer).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->_lines_buffer).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5)) {
      nextToken(__return_storage_ptr__,this);
    }
    else {
      (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
      super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
      _M_engaged = false;
    }
    return __return_storage_ptr__;
  }
  psVar1 = (string *)__cxa_allocate_exception(0x28);
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"StreamError","");
  *(string **)psVar1 = psVar1 + 0x10;
  std::__cxx11::string::_M_construct<char*>(psVar1,local_40,local_40 + local_38);
  *(undefined8 *)(psVar1 + 0x20) = 0;
  __cxa_throw(psVar1,&Error::typeinfo,Error::~Error);
}

Assistant:

std::optional<Token> Tokenizer::NextToken() {
	if (!_initialized)
		readAll();
	if (_rdr.bad()) {
		throw Error("StreamError");
	}
	if (isEOF()) {
		return {};
	}
	return nextToken();
}